

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()
          (pack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *this,packer<msgpack::v1::sbuffer> *o,string *v)

{
  uint32_t l;
  char *in_RDX;
  packer<msgpack::v1::sbuffer> *in_RSI;
  uint32_t size;
  
  std::__cxx11::string::size();
  l = checked_get_container_size<unsigned_long>(0x1e5f05);
  packer<msgpack::v1::sbuffer>::pack_str(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  std::__cxx11::string::data();
  packer<msgpack::v1::sbuffer>::pack_str_body(in_RSI,in_RDX,l);
  return in_RSI;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const std::string& v) const {
        uint32_t size = checked_get_container_size(v.size());
        o.pack_str(size);
        o.pack_str_body(v.data(), size);
        return o;
    }